

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O0

void __thiscall
vkt::shaderexecutor::VariableP<tcu::Vector<float,_4>_>::VariableP
          (VariableP<tcu::Vector<float,_4>_> *this,Variable<tcu::Vector<float,_4>_> *ptr)

{
  Variable<tcu::Vector<float,_4>_> *ptr_local;
  VariableP<tcu::Vector<float,_4>_> *this_local;
  
  de::SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>::SharedPtr
            (&this->super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>,
             ptr);
  return;
}

Assistant:

explicit	VariableP	(const Variable<T>* ptr) : Super(ptr) {}